

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

int64_t __thiscall minja::Value::to_int(Value *this)

{
  value_t vVar1;
  bool bVar2;
  long lVar3;
  double dVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar2 = is_null(this);
  if (!bVar2) {
    vVar1 = (this->primitive_).m_data.m_type;
    if (vVar1 == boolean) {
      bVar2 = get<bool>(this);
      return (ulong)bVar2;
    }
    if ((byte)(vVar1 - number_integer) < 3) {
      dVar4 = get<double>(this);
      return (long)dVar4;
    }
    if (vVar1 == string) {
      get<std::__cxx11::string>(&local_30,this);
      lVar3 = std::__cxx11::stol(&local_30,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_30);
      return lVar3;
    }
  }
  return 0;
}

Assistant:

int64_t to_int() const {
    if (is_null()) return 0;
    if (is_boolean()) return get<bool>() ? 1 : 0;
    if (is_number()) return static_cast<int64_t>(get<double>());
    if (is_string()) {
      try {
        return std::stol(get<std::string>());
      } catch (const std::exception &) {
        return 0;
      }
    }
    return 0;
  }